

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

bool dg::llvmdg::anon_unknown_2::callIsCompatible(Function *F,CallInst *CI,CallCompatibility policy)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  const_arg_iterator pAVar4;
  const_arg_iterator pAVar5;
  CallInst *pCVar6;
  bool bVar7;
  ulong uVar8;
  
  uVar2 = llvm::CallBase::arg_size((CallBase *)CI);
  uVar3 = (ulong)uVar2;
  if ((uVar3 < *(ulong *)(F + 0x60)) ||
     ((cVar1 = llvm::Type::canLosslesslyBitCastTo
                         ((Type *)**(undefined8 **)(*(long *)(F + 0x18) + 0x10)), cVar1 == '\0' &&
      (((*(uint *)(**(long **)(*(long *)(F + 0x18) + 0x10) + 8) & 0xfd) != 0xd ||
       ((*(uint *)(*(long *)CI + 8) & 0xfd) != 0xd)))))) {
    bVar7 = false;
  }
  else {
    pAVar4 = llvm::Function::arg_begin(F);
    pAVar5 = llvm::Function::arg_end(F);
    uVar8 = 0;
    pCVar6 = CI;
    for (; bVar7 = pAVar4 == pAVar5 || uVar3 <= uVar8, pAVar4 != pAVar5 && uVar3 > uVar8;
        pAVar4 = pAVar4 + 0x28) {
      if ((((*(uint *)((Type *)**(undefined8 **)(pCVar6 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5))
                      + 8) & 0xfd) != 0xd) || ((*(uint *)(*(long *)pAVar4 + 8) & 0xfd) != 0xd)) &&
         (cVar1 = llvm::Type::canLosslesslyBitCastTo
                            ((Type *)**(undefined8 **)
                                       (pCVar6 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5))),
         cVar1 == '\0')) {
        return bVar7;
      }
      uVar8 = uVar8 + 1;
      pCVar6 = pCVar6 + 0x20;
    }
  }
  return bVar7;
}

Assistant:

inline bool
callIsCompatible(const llvm::Function *F, const llvm::CallInst *CI,
                 CallCompatibility policy = CallCompatibility::LOOSE) {
    using namespace llvm;

#if LLVM_VERSION_MAJOR >= 8
    auto max_idx = CI->arg_size();
#else
    auto max_idx = CI->getNumArgOperands();
#endif

    if (policy != CallCompatibility::MATCHING_ARGS) {
        if (F->isVarArg()) {
            if (F->arg_size() > max_idx) {
                return false;
            }
        } else if (F->arg_size() != max_idx) {
            if (policy == CallCompatibility::STRICT ||
                F->arg_size() > max_idx) {
                // too few arguments
                return false;
            }
        }

        if (!F->getReturnType()->canLosslesslyBitCastTo(CI->getType())) {
            // it showed up that the loosless bitcast is too strict
            // alternative since we can use the constexpr castings
            if (!(isPointerOrIntegerTy(F->getReturnType()) &&
                  isPointerOrIntegerTy(CI->getType()))) {
                return false;
            }
        }
    }

    size_t idx = 0;
    for (auto A = F->arg_begin(), E = F->arg_end(); idx < max_idx && A != E;
         ++A, ++idx) {
        Type *CTy = CI->getArgOperand(idx)->getType();
        Type *ATy = A->getType();

        if (!(isPointerOrIntegerTy(CTy) && isPointerOrIntegerTy(ATy)))
            if (!CTy->canLosslesslyBitCastTo(ATy)) {
                return false;
            }
    }

    return true;
}